

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_long_Test::TestBody
          (ByteBufferTest_test_read_write_long_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  long local_88;
  int64_t long2;
  Message local_78;
  long local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_48 [8];
  ByteBuffer byte_buffer1;
  long local_18;
  int64_t long1;
  ByteBufferTest_test_read_write_long_Test *this_local;
  
  local_18 = 0xd15fc7c15;
  long1 = (int64_t)this;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_48,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)local_48);
  local_70 = bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_68,"long1","byte_buffer1.ReadLong()",&local_18,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&long2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&long2,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&long2);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_88 = -0x29da6032d;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)&gtest_ar_1.message_);
  local_d0 = bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_c8,"long2","byte_buffer2.ReadLong()",&local_88,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_48);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_long)
{
    int64_t long1 = 56203443221;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteLong(long1);
    EXPECT_EQ(long1, byte_buffer1.ReadLong());

    int64_t long2 = -11234837293;
    ByteBuffer byte_buffer2(8);
    byte_buffer2.WriteLong(long2);
    EXPECT_EQ(long2, byte_buffer2.ReadLong());
}